

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QFileSystemEntry *
QFileSystemEngine::getRawLinkPath(QFileSystemEntry *link,QFileSystemMetaData *data)

{
  char *in_RSI;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QString ret;
  QByteArray path;
  QString *in_stack_ffffffffffffff58;
  QFileSystemEntry local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.m_nativeFilePath.d.size = -0x5555555555555556;
  local_40.m_nativeFilePath.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_40.m_nativeFilePath.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(&local_40);
  QByteArray::constData((QByteArray *)0x17982c);
  qt_readlink(in_RSI);
  QByteArray::~QByteArray((QByteArray *)0x17984b);
  QFile::decodeName((QByteArray *)in_stack_ffffffffffffff58);
  QFileSystemEntry::QFileSystemEntry(in_RDI,in_stack_ffffffffffffff58);
  QString::~QString((QString *)0x17988e);
  QByteArray::~QByteArray((QByteArray *)0x179898);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::getRawLinkPath(const QFileSystemEntry &link,
                                                   QFileSystemMetaData &data)
{
    Q_UNUSED(data)
    const QByteArray path = qt_readlink(link.nativeFilePath().constData());
    const QString ret = QFile::decodeName(path);
    return QFileSystemEntry(ret);
}